

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

void ImfFloatToHalf(float f,ImfHalf *h)

{
  undefined8 in_RAX;
  half local_12;
  
  local_12._h = (uint16_t)((ulong)in_RAX >> 0x30);
  Imath_3_2::half::half(&local_12,f);
  *h = local_12._h;
  return;
}

Assistant:

void
ImfFloatToHalf (float f, ImfHalf* h)
{
    *h = half (f).bits ();
}